

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandCaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandCaseStatement,nonstd::span_lite::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  RandCaseStatement *this_00;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> local_30;
  SourceRange *local_20;
  SourceRange *args_local_1;
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *args_local;
  BumpAllocator *this_local;
  
  local_20 = args_1;
  args_local_1 = (SourceRange *)args;
  args_local = (span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *)this;
  this_00 = (RandCaseStatement *)allocate(this,0x30,8);
  nonstd::span_lite::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL,_0>
            (&local_30,
             (span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *)args_local_1);
  ast::RandCaseStatement::RandCaseStatement(this_00,local_30,*local_20);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }